

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O2

void do_cmd_note(void)

{
  _Bool _Var1;
  int iVar2;
  char *fmt;
  char *pcVar3;
  char tmp [70];
  char note [90];
  
  my_strcpy(tmp,"",0x46);
  my_strcpy(note,"",0x5a);
  _Var1 = get_string("Note: ",tmp,0x46);
  if (!_Var1) {
    return;
  }
  if ((tmp[0] & 0xdfU) == 0) {
    return;
  }
  iVar2 = bcmp(tmp,"/say ",5);
  if (iVar2 == 0) {
    pcVar3 = tmp + 5;
    fmt = "-- %s says: \"%s\"";
  }
  else {
    iVar2 = bcmp(tmp,"/me",3);
    if (iVar2 != 0) {
      strnfmt(note,0x5a,"-- Note: %s",tmp);
      goto LAB_0012f1d5;
    }
    pcVar3 = tmp + 3;
    fmt = "-- %s%s";
  }
  strnfmt(note,0x5a,fmt,player->full_name,pcVar3);
LAB_0012f1d5:
  msg("%s",note + 3);
  history_add(player,note,L'\a');
  return;
}

Assistant:

void do_cmd_note(void)
{
	/* Allocate/Initialize strings to get and format user input. */
	char tmp[70];
	char note[90];
	my_strcpy(tmp, "", sizeof(tmp));
	my_strcpy(note, "", sizeof(note));

	/* Read a line of input from the user */
	if (!get_string("Note: ", tmp, sizeof(tmp))) return;

	/* Ignore empty notes */
	if (!tmp[0] || (tmp[0] == ' ')) return;

	/* Format the note correctly, supporting some cute /me commands */
	if (strncmp(tmp, "/say ", 5) == 0)
		strnfmt(note, sizeof(note), "-- %s says: \"%s\"", player->full_name,
				&tmp[5]);
	else if (strncmp(tmp, "/me", 3) == 0)
		strnfmt(note, sizeof(note), "-- %s%s", player->full_name, &tmp[3]);
	else
		strnfmt(note, sizeof(note), "-- Note: %s", tmp);

	/* Display the note (omitting the "-- " prefix) */
	msg("%s", &note[3]);

	/* Add a history entry */
	history_add(player, note, HIST_USER_INPUT);
}